

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_test.c
# Opt level: O2

void CheckGet(leveldb_t *db,leveldb_readoptions_t *options,char *key,char *expected)

{
  size_t keylen;
  char *val;
  size_t val_len;
  char *err;
  
  err = (char *)0x0;
  keylen = strlen(key);
  val = leveldb_get(db,options,key,keylen,&val_len,&err);
  if (err == (char *)0x0) {
    CheckEqual(expected,val,val_len);
    Free(&val);
    return;
  }
  fprintf(_stderr,"%s:%d: %s: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/c_test.c"
          ,0x3f,phase);
  abort();
}

Assistant:

static void CheckGet(
    leveldb_t* db,
    const leveldb_readoptions_t* options,
    const char* key,
    const char* expected) {
  char* err = NULL;
  size_t val_len;
  char* val;
  val = leveldb_get(db, options, key, strlen(key), &val_len, &err);
  CheckNoError(err);
  CheckEqual(expected, val, val_len);
  Free(&val);
}